

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O3

bool __thiscall Clasp::SatBuilder::addClause(SatBuilder *this,LitVec *clause,wsum_t cw)

{
  LitVec *this_00;
  pointer pLVar1;
  Var VVar2;
  bool bVar3;
  ulong uVar4;
  Result RVar5;
  Memcpy<Clasp::Literal> local_30;
  
  bVar3 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  if (bVar3) {
    bVar3 = satisfied(this,clause);
    if (!bVar3) {
      if ((-1 < cw) && (this->hardWeight_ == cw || (cw & 0xffffffff80000000U) == 0)) {
        if (this->hardWeight_ == cw) {
          local_30.first_ = (Literal *)((ulong)local_30.first_._4_4_ << 0x20);
          bVar3 = false;
          RVar5 = ClauseCreator::create
                            (*(((this->super_ProgramBuilder).ctx_)->solvers_).ebo_.buf,clause,0,
                             (ConstraintInfo *)&local_30);
          if (((undefined1  [16])RVar5 & (undefined1  [16])0x2) == (undefined1  [16])0x0) {
            bVar3 = markAssigned(this);
          }
        }
        else {
          this_00 = &this->softClauses_;
          local_30.first_._0_4_ = (uint)cw;
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (this_00,(Literal *)&local_30);
          uVar4 = (ulong)(clause->ebo_).size;
          if (uVar4 < 2) {
            if (uVar4 == 0) {
              local_30.first_._0_4_ = 0;
            }
            else {
              local_30.first_._0_4_ = (clause->ebo_).buf[uVar4 - 1].rep_ & 0xfffffffe ^ 2;
            }
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (this_00,(Literal *)&local_30);
          }
          else {
            VVar2 = this->vars_;
            this->vars_ = VVar2 + 1;
            local_30.first_._0_4_ = VVar2 * 4 + 4;
            bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                      (this_00,(Literal *)&local_30);
            local_30.first_ = (clause->ebo_).buf;
            bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>::
            insert_impl<unsigned_int,bk_lib::detail::Memcpy<Clasp::Literal>>
                      ((pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>> *)this_00,
                       (this->softClauses_).ebo_.buf + (this->softClauses_).ebo_.size,
                       (clause->ebo_).size,&local_30);
          }
          pLVar1 = (this->softClauses_).ebo_.buf + ((this->softClauses_).ebo_.size - 1);
          pLVar1->rep_ = pLVar1->rep_ | 1;
          bVar3 = true;
        }
        return bVar3;
      }
      Potassco::fail(-2,"bool Clasp::SatBuilder::addClause(LitVec &, wsum_t)",0x88,
                     "cw >= 0 && (cw <= std::numeric_limits<weight_t>::max() || cw == hardWeight_)",
                     "Clause weight out of bounds",0);
    }
  }
  bVar3 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  return bVar3;
}

Assistant:

bool SatBuilder::addClause(LitVec& clause, wsum_t cw) {
	if (!ctx()->ok() || satisfied(clause)) { return ctx()->ok(); }
	POTASSCO_REQUIRE(cw >= 0 && (cw <= std::numeric_limits<weight_t>::max() || cw == hardWeight_), "Clause weight out of bounds");
	if (cw == hardWeight_) {
		return ClauseCreator::create(*ctx()->master(), clause, Constraint_t::Static).ok() && markAssigned();
	}
	else {
		// Store weight, relaxation var, and (optionally) clause
		softClauses_.push_back(Literal::fromRep((uint32)cw));
		if      (clause.size() > 1){ softClauses_.push_back(posLit(++vars_)); softClauses_.insert(softClauses_.end(), clause.begin(), clause.end()); }
		else if (!clause.empty())  { softClauses_.push_back(~clause.back());  }
		else                       { softClauses_.push_back(lit_true()); }
		softClauses_.back().flag(); // mark end of clause
	}
	return true;
}